

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O1

Gia_ManSwi_t * Gia_ManSwiCreate(Gia_Man_t *pAig,Gia_ParSwi_t *pPars)

{
  Gia_ManSwi_t *pGVar1;
  Gia_Man_t *pGVar2;
  uint *puVar3;
  int *piVar4;
  long lVar5;
  
  pGVar1 = (Gia_ManSwi_t *)malloc(0x38);
  pGVar1->pAig = (Gia_Man_t *)0x0;
  pGVar1->pPars = (Gia_ParSwi_t *)0x0;
  *(undefined8 *)&pGVar1->nWords = 0;
  pGVar1->pDataSim = (uint *)0x0;
  pGVar1->pDataSimCis = (uint *)0x0;
  pGVar1->pDataSimCos = (uint *)0x0;
  pGVar1->pData1 = (int *)0x0;
  pGVar2 = Gia_ManFront(pAig);
  pGVar1->pAig = pGVar2;
  pGVar1->pPars = pPars;
  lVar5 = (long)pPars->nWords;
  pGVar1->nWords = pPars->nWords;
  puVar3 = (uint *)malloc(pGVar2->nFront * lVar5 * 4);
  pGVar1->pDataSim = puVar3;
  puVar3 = (uint *)malloc(pGVar2->vCis->nSize * lVar5 * 4);
  pGVar1->pDataSimCis = puVar3;
  puVar3 = (uint *)malloc(pGVar2->vCos->nSize * lVar5 * 4);
  pGVar1->pDataSimCos = puVar3;
  piVar4 = (int *)calloc((long)pAig->nObjs,4);
  pGVar1->pData1 = piVar4;
  return pGVar1;
}

Assistant:

Gia_ManSwi_t * Gia_ManSwiCreate( Gia_Man_t * pAig, Gia_ParSwi_t * pPars )
{
    Gia_ManSwi_t * p;
    p = ABC_ALLOC( Gia_ManSwi_t, 1 );
    memset( p, 0, sizeof(Gia_ManSwi_t) );
    p->pAig   = Gia_ManFront( pAig );
    p->pPars  = pPars;
    p->nWords = pPars->nWords;
    p->pDataSim = ABC_ALLOC( unsigned, p->nWords * p->pAig->nFront );
    p->pDataSimCis = ABC_ALLOC( unsigned, p->nWords * Gia_ManCiNum(p->pAig) );
    p->pDataSimCos = ABC_ALLOC( unsigned, p->nWords * Gia_ManCoNum(p->pAig) );
    p->pData1 = ABC_CALLOC( int, Gia_ManObjNum(pAig) );
    return p;
}